

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_0::SizeTestInstance::SizeTestInstance
          (SizeTestInstance *this,Context *context,Texture *texture,VkFormat format)

{
  MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_00;
  int iVar1;
  int i;
  long lVar2;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Buffer *this_01;
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_78;
  VkBufferCreateInfo local_68;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__SizeTestInstance_00d33c98;
  lVar2 = 0;
  do {
    (this->m_texture).m_layerSize.m_data[lVar2] = (texture->m_layerSize).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (this->m_texture).m_numSamples = texture->m_numSamples;
  iVar1 = texture->m_numLayers;
  (this->m_texture).m_type = texture->m_type;
  (this->m_texture).m_numLayers = iVar1;
  this->m_format = format;
  this->m_resultBufferSizeBytes = 0xc;
  this_00 = &this->m_resultBuffer;
  (this->m_resultBuffer).
  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
       (Buffer *)0x0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  this_01 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_68,this->m_resultBufferSizeBytes,0x20);
  image::Buffer::Buffer(this_01,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  local_78.m_data.ptr = (Buffer *)0x0;
  if ((this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).
      m_data.ptr != this_01) {
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&this_00->
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
    (this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data.
    ptr = this_01;
  }
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
            (&local_78);
  return;
}

Assistant:

SizeTestInstance::SizeTestInstance (Context& context, const Texture& texture, const VkFormat format)
	: TestInstance				(context)
	, m_texture					(texture)
	, m_format					(format)
	, m_resultBufferSizeBytes	(3 * sizeof(deUint32))	// ivec3 in shader
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// Create an SSBO for shader output.

	m_resultBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		MemoryRequirement::HostVisible));
}